

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v11::vprint_buffered(FILE *f,string_view fmt,format_args args)

{
  memory_buffer buffer;
  buffer<char> local_228;
  char local_208 [504];
  
  local_228.size_ = 0;
  local_228.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_228.capacity_ = 500;
  local_228.ptr_ = local_208;
  detail::vformat_to(&local_228,fmt,args,(locale_ref)0x0);
  detail::fwrite_all(local_228.ptr_,local_228.size_,f);
  if (local_228.ptr_ != local_208) {
    free(local_228.ptr_);
  }
  return;
}

Assistant:

FMT_FUNC void vprint_buffered(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  detail::print(f, {buffer.data(), buffer.size()});
}